

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

Vector3f pbrt::EqualAreaSquareToSphere(Point2f p)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float __x;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f VVar12;
  float local_28;
  undefined1 extraout_var [60];
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = p.super_Tuple2<pbrt::Point2,_float>;
  if ((0.0 <= p.super_Tuple2<pbrt::Point2,_float>.x) &&
     (p.super_Tuple2<pbrt::Point2,_float>.x <= 1.0)) {
    auVar5 = vmovshdup_avx(auVar7._0_16_);
    if ((0.0 <= auVar5._0_4_) && (auVar5._0_4_ <= 1.0)) {
      auVar9._8_4_ = 0x40000000;
      auVar9._0_8_ = 0x4000000040000000;
      auVar9._12_4_ = 0x40000000;
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar5._8_4_ = 0xbf800000;
      auVar5._0_8_ = 0xbf800000bf800000;
      auVar5._12_4_ = 0xbf800000;
      auVar3 = vfmadd213ps_avx512vl(auVar9,auVar7._0_16_,auVar5);
      auVar5 = vandps_avx(auVar3,auVar10);
      auVar4 = vshufps_avx(auVar5,auVar5,0xf5);
      auVar11 = ZEXT416((uint)(1.0 - (auVar5._0_4_ + auVar4._0_4_)));
      auVar9 = vandps_avx(auVar11,auVar10);
      fVar1 = 1.0 - auVar9._0_4_;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        __x = ((auVar4._0_4_ - auVar5._0_4_) / fVar1 + 1.0) * 3.1415927 * 0.25;
      }
      else {
        __x = 0.7853982;
      }
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar4 = vpternlogd_avx512vl(auVar11,ZEXT416((uint)(1.0 - fVar1 * fVar1)),auVar4,0xd8);
      fVar6 = cosf(__x);
      auVar8._0_4_ = sinf(__x);
      auVar8._4_60_ = extraout_var;
      auVar5 = vmaxss_avx(ZEXT416((uint)(2.0 - fVar1 * fVar1)),ZEXT416(0));
      auVar2._4_4_ = extraout_XMM0_Db;
      auVar2._0_4_ = fVar6;
      auVar2._8_4_ = extraout_XMM0_Dc;
      auVar2._12_4_ = extraout_XMM0_Dd;
      auVar9 = vsqrtss_avx(auVar5,auVar5);
      auVar5 = vinsertps_avx(auVar2,auVar8._0_16_,0x10);
      auVar11._8_4_ = 0x7fffffff;
      auVar11._0_8_ = 0x7fffffff7fffffff;
      auVar11._12_4_ = 0x7fffffff;
      auVar5 = vpternlogd_avx512vl(auVar3,auVar5,auVar11,0xd8);
      VVar12.super_Tuple3<pbrt::Vector3,_float>.x = auVar9._0_4_ * fVar1 * auVar5._0_4_;
      VVar12.super_Tuple3<pbrt::Vector3,_float>.y = auVar9._0_4_ * fVar1 * auVar5._4_4_;
      local_28 = auVar4._0_4_;
      VVar12.super_Tuple3<pbrt::Vector3,_float>.z = local_28;
      return (Vector3f)VVar12.super_Tuple3<pbrt::Vector3,_float>;
    }
  }
  LogFatal<char_const(&)[45]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.cpp"
             ,0x125,"Check failed: %s",(char (*) [45])"p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1"
            );
}

Assistant:

Vector3f EqualAreaSquareToSphere(Point2f p) {
    CHECK(p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1);
    // Transform _p_ to $[-1,1]^2$ and compute absolute values
    Float u = 2 * p.x - 1, v = 2 * p.y - 1;
    Float up = std::abs(u), vp = std::abs(v);

    // Compute radius _r_ as signed distance from diagonal
    Float signedDistance = 1 - (up + vp);
    Float d = std::abs(signedDistance);
    Float r = 1 - d;

    // Compute angle $\phi$ for square to sphere mapping
    Float phi = (r == 0 ? 1 : (vp - up) / r + 1) * Pi / 4;

    // Find $z$ coordinate for spherical direction
    Float z = std::copysign(1 - Sqr(r), signedDistance);

    // Compute $\cos \phi$ and $\sin \phi$ for original quadrant and return vector
    Float cosPhi = std::copysign(std::cos(phi), u);
    Float sinPhi = std::copysign(std::sin(phi), v);
    return Vector3f(cosPhi * r * SafeSqrt(2 - Sqr(r)), sinPhi * r * SafeSqrt(2 - Sqr(r)),
                    z);
}